

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O0

child_tags_list_t * __thiscall
cfgfile::tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
children(tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t> *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  long in_RDI;
  child_tags_list_t *local_8;
  
  if (tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,cfgfile::string_trait_t>::children()
      ::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,cfgfile::string_trait_t>
                                 ::children()::empty);
    if (iVar2 != 0) {
      std::
      vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ::vector((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)0x125868);
      __cxa_atexit(std::
                   vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                   ::~vector,&children::empty,&__dso_handle);
      __cxa_guard_release(&tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,cfgfile::string_trait_t>
                           ::children()::empty);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x78));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cfgfile::generator::cfg::tag_field_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1258ae);
    iVar2 = (*(peVar3->super_tag_no_value_t<cfgfile::string_trait_t>).
              super_tag_t<cfgfile::string_trait_t>._vptr_tag_t[2])();
    local_8 = (child_tags_list_t *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_8 = &children::empty;
  }
  return local_8;
}

Assistant:

const typename tag_t< Trait >::child_tags_list_t & children() const override
	{
		static const typename tag_t< Trait >::child_tags_list_t empty;

		if( m_current )
			return m_current->children();
		else
			return empty;
	}